

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

size_t Node_MaxDataSize(node *p,dataid Id,dataflags Flags,int QueryType)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (2 < QueryType - 0x28U) {
    __assert_fail("QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x7ae,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
  }
  uVar3 = Flags & 0x3f;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    if (0x29 < (uint)uVar3) {
      __assert_fail("Flags < MAX_PARAMTYPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x7b4,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
    }
    uVar2 = (ulong)ParamSize[uVar3];
    if ((uVar3 != 4) && ((0x188010010U >> uVar3 & 1) != 0)) {
      if (p == (node *)0x0) {
        __assert_fail("(const void*)(p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x7b8,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
      }
      sVar1 = (**(code **)((long)p->VMT + 0x30))(p,Id,0x27);
      uVar2 = 0x100;
      if (sVar1 != 0) {
        uVar2 = sVar1;
      }
    }
  }
  return uVar2;
}

Assistant:

NOINLINE size_t Node_MaxDataSize(node* p, dataid Id, dataflags Flags, int QueryType)
{
    size_t Size;
    assert(QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET);
    Flags &= TYPE_MASK;
    //assert(Flags != 0);
    if (Flags == 0)
        return 0;

    assert(Flags < MAX_PARAMTYPE);
    Size = ParamSize[Flags];
    if (Size == MAXDATA && Flags != TYPE_STRING) // we don't care about how much space the non-dynamic string needs (except in MetaSet())
    {
        Size = (size_t)Node_Meta(p,Id,META_PARAM_SIZE);
        if (!Size)
            Size = MAXDATA;
    }
    return Size;
}